

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall cppcms::application::attach(application *this,application *app)

{
  application *in_RSI;
  application *in_RDI;
  vector<cppcms::application_*,_std::allocator<cppcms::application_*>_> *unaff_retaddr;
  application *__x;
  
  __x = in_RDI;
  booster::hold_ptr<cppcms::application::_data>::operator->(&in_RDI->d);
  std::vector<cppcms::application_*,_std::allocator<cppcms::application_*>_>::push_back
            (unaff_retaddr,(value_type *)__x);
  add(in_RSI,in_RDI);
  return;
}

Assistant:

void application::attach(application *app)
{
	d->managed_children.push_back(app);
	add(*app);
}